

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  AssertionResult *this_00;
  
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1c63dc);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)*in_RDI," ");
    this_00 = (AssertionResult *)&stack0xffffffffffffffd8;
    AssertionResult::getExpression_abi_cxx11_(this_00);
    std::operator<<(poVar2,(string *)this_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if( result.hasExpression() ) {
                    stream << " " << result.getExpression();
                }
            }